

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerators::SetupAutoUicTarget
          (cmQtAutoGenerators *this,cmTarget *target,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *configUicOptions)

{
  undefined8 this_00;
  bool bVar1;
  int iVar2;
  cmMakefile *this_01;
  char *pcVar3;
  ulong uVar4;
  reference pbVar5;
  mapped_type *this_02;
  reference ppcVar6;
  string *psVar7;
  cmTarget *pcVar8;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  cmTarget *local_450;
  cmTarget *qt4Uic;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  cmTarget *local_3d0;
  cmTarget *qt5Uic;
  string targetName;
  allocator local_381;
  string local_380;
  string local_360;
  allocator local_339;
  string local_338;
  allocator local_312;
  allocator local_311;
  string local_310;
  undefined1 local_2f0 [8];
  string opts;
  undefined1 local_2a8 [8];
  string absFile;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_278;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_270;
  const_iterator fileIt;
  char *sep;
  string uiFileOptions;
  string uiFileFiles;
  undefined1 local_200 [8];
  string config_uic_opts;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  const_iterator li;
  string local_1c0;
  string local_1a0;
  string local_180;
  string *local_160;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string _uic_opts;
  string local_118;
  char *local_f8;
  char *qtVersion;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> uiFilesWithOptions;
  allocator local_b1;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  undefined1 local_70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipVec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  skipped;
  cmMakefile *makefile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *configUicOptions_local;
  cmTarget *target_local;
  cmQtAutoGenerators *this_local;
  
  this_01 = cmTarget::GetMakefile(target);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&skipVec.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70);
  cmSystemTools::ExpandListArgument
            (&this->SkipUic,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_70,false);
  local_88._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_70);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&skipVec.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_88,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"_skip_uic",&local_b1);
  cmOutputConverter::EscapeForCMake
            ((string *)
             &uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->SkipUic);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(this_01,&local_b0,pcVar3);
  std::__cxx11::string::~string
            ((string *)
             &uiFilesWithOptions.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  cmMakefile::GetQtUiFilesWithOptions
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&qtVersion,this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"_target_qt_version",
             (allocator *)(_uic_opts.field_2._M_local_buf + 0xf));
  pcVar3 = cmMakefile::GetDefinition(this_01,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)(_uic_opts.field_2._M_local_buf + 0xf));
  local_f8 = pcVar3;
  std::__cxx11::string::string
            ((string *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&config);
  cmMakefile::GetConfigurations
            (&local_180,this_01,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,true);
  local_160 = &local_180;
  GetUicOpts(target,local_160,
             (string *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    cmOutputConverter::EscapeForCMake
              (&local_1a0,
               (string *)
               &configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::operator=
              ((string *)
               &configs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c0,"_uic_target_options",(allocator *)((long)&li._M_current + 7));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_01,&local_1c0,pcVar3);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&li._M_current + 7));
  }
  local_1d8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_1d0,&local_1d8);
  while( true ) {
    config_uic_opts.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1d0,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&config_uic_opts.field_2 + 8));
    if (!bVar1) break;
    std::__cxx11::string::string((string *)local_200);
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_1d0);
    GetUicOpts(target,pbVar5,(string *)local_200);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_200,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &configs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      cmOutputConverter::EscapeForCMake
                ((string *)((long)&uiFileFiles.field_2 + 8),(string *)local_200);
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1d0);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](configUicOptions,pbVar5);
      std::__cxx11::string::operator=
                ((string *)this_02,(string *)(uiFileFiles.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(uiFileFiles.field_2._M_local_buf + 8));
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)
                   &configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_200);
      }
    }
    std::__cxx11::string::~string((string *)local_200);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_1d0);
  }
  std::__cxx11::string::string((string *)(uiFileOptions.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&sep);
  fileIt._M_current = (cmSourceFile **)0xaac4df;
  local_278._M_current =
       (cmSourceFile **)
       std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                 ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&qtVersion);
  __gnu_cxx::
  __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  __normal_iterator<cmSourceFile**>
            ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
              *)&local_270,&local_278);
  while( true ) {
    sf = (cmSourceFile *)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&qtVersion);
    bVar1 = __gnu_cxx::operator!=
                      (&local_270,
                       (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                        *)&sf);
    if (!bVar1) break;
    ppcVar6 = __gnu_cxx::
              __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&local_270);
    absFile.field_2._8_8_ = *ppcVar6;
    psVar7 = cmSourceFile::GetFullPath((cmSourceFile *)absFile.field_2._8_8_,(string *)0x0);
    cmsys::SystemTools::GetRealPath((string *)local_2a8,psVar7,(string *)0x0);
    pVar9 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&skipVec.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_2a8)
    ;
    if (((pVar9.second ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::operator+=
                ((string *)(uiFileOptions.field_2._M_local_buf + 8),(char *)fileIt._M_current);
      std::__cxx11::string::operator+=
                ((string *)(uiFileOptions.field_2._M_local_buf + 8),(string *)local_2a8);
      std::__cxx11::string::operator+=((string *)&sep,(char *)fileIt._M_current);
      this_00 = absFile.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_310,"AUTOUIC_OPTIONS",&local_311);
      pcVar3 = cmSourceFile::GetProperty((cmSourceFile *)this_00,&local_310);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2f0,pcVar3,&local_312);
      std::allocator<char>::~allocator((allocator<char> *)&local_312);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      cmsys::SystemTools::ReplaceString((string *)local_2f0,";","@list_sep@");
      std::__cxx11::string::operator+=((string *)&sep,(string *)local_2f0);
      fileIt._M_current = (cmSourceFile **)0xa5cffc;
      std::__cxx11::string::~string((string *)local_2f0);
      opts.field_2._12_4_ = 0;
    }
    else {
      opts.field_2._12_4_ = 7;
    }
    std::__cxx11::string::~string((string *)local_2a8);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&local_270);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_338,"_qt_uic_options_files",&local_339);
  cmOutputConverter::EscapeForCMake(&local_360,(string *)((long)&uiFileOptions.field_2 + 8));
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(this_01,&local_338,pcVar3);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"_qt_uic_options_options",&local_381);
  cmOutputConverter::EscapeForCMake((string *)((long)&targetName.field_2 + 8),(string *)&sep);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition(this_01,&local_380,pcVar3);
  std::__cxx11::string::~string((string *)(targetName.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  psVar7 = cmTarget::GetName_abi_cxx11_(target);
  std::__cxx11::string::string((string *)&qt5Uic,(string *)psVar7);
  iVar2 = strcmp(local_f8,"5");
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f0,"Qt5::uic",&local_3f1);
    pcVar8 = cmMakefile::FindTargetToUse(this_01,&local_3f0,false);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    local_3d0 = pcVar8;
    if (pcVar8 != (cmTarget *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_418,"_qt_uic_executable",&local_419);
      pcVar8 = local_3d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_440,"",(allocator *)((long)&qt4Uic + 7));
      pcVar3 = cmTarget::GetLocation(pcVar8,&local_440);
      cmMakefile::AddDefinition(this_01,&local_418,pcVar3);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)((long)&qt4Uic + 7));
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
    }
  }
  else {
    iVar2 = strcmp(local_f8,"4");
    if (iVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_470,"Qt4::uic",&local_471);
      pcVar8 = cmMakefile::FindTargetToUse(this_01,&local_470,false);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator((allocator<char> *)&local_471);
      local_450 = pcVar8;
      if (pcVar8 == (cmTarget *)0x0) {
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error("Qt4::uic target not found ",pcVar3,(char *)0x0,(char *)0x0);
        opts.field_2._12_4_ = 1;
        goto LAB_006506a9;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_498,"_qt_uic_executable",&local_499);
      pcVar8 = local_450;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4c0,"",&local_4c1);
      pcVar3 = cmTarget::GetLocation(pcVar8,&local_4c0);
      cmMakefile::AddDefinition(this_01,&local_498,pcVar3);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("The CMAKE_AUTOUIC feature supports only Qt 4 and Qt 5 ",pcVar3,(char *)0x0,
                 (char *)0x0);
    }
  }
  opts.field_2._12_4_ = 0;
LAB_006506a9:
  std::__cxx11::string::~string((string *)&qt5Uic);
  std::__cxx11::string::~string((string *)&sep);
  std::__cxx11::string::~string((string *)(uiFileOptions.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&config);
  std::__cxx11::string::~string
            ((string *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&qtVersion);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_70);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&skipVec.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmQtAutoGenerators::SetupAutoUicTarget(cmTarget const* target,
                          std::map<std::string, std::string> &configUicOptions)
{
  cmMakefile *makefile = target->GetMakefile();

  std::set<std::string> skipped;
  std::vector<std::string> skipVec;
  cmSystemTools::ExpandListArgument(this->SkipUic, skipVec);
  skipped.insert(skipVec.begin(), skipVec.end());

  makefile->AddDefinition("_skip_uic",
          cmOutputConverter::EscapeForCMake(this->SkipUic).c_str());

  std::vector<cmSourceFile*> uiFilesWithOptions
                                        = makefile->GetQtUiFilesWithOptions();

  const char *qtVersion = makefile->GetDefinition("_target_qt_version");

  std::string _uic_opts;
  std::vector<std::string> configs;
  const std::string& config = makefile->GetConfigurations(configs);
  GetUicOpts(target, config, _uic_opts);

  if (!_uic_opts.empty())
    {
    _uic_opts = cmOutputConverter::EscapeForCMake(_uic_opts);
    makefile->AddDefinition("_uic_target_options", _uic_opts.c_str());
    }
  for (std::vector<std::string>::const_iterator li = configs.begin();
       li != configs.end(); ++li)
    {
    std::string config_uic_opts;
    GetUicOpts(target, *li, config_uic_opts);
    if (config_uic_opts != _uic_opts)
      {
      configUicOptions[*li] =
                    cmOutputConverter::EscapeForCMake(config_uic_opts);
      if(_uic_opts.empty())
        {
        _uic_opts = config_uic_opts;
        }
      }
    }

  std::string uiFileFiles;
  std::string uiFileOptions;
  const char* sep = "";

  for(std::vector<cmSourceFile*>::const_iterator fileIt =
      uiFilesWithOptions.begin();
      fileIt != uiFilesWithOptions.end();
      ++fileIt)
    {
    cmSourceFile* sf = *fileIt;
    std::string absFile = cmsys::SystemTools::GetRealPath(
                                                    sf->GetFullPath());

    if (!skipped.insert(absFile).second)
      {
      continue;
      }
    uiFileFiles += sep;
    uiFileFiles += absFile;
    uiFileOptions += sep;
    std::string opts = sf->GetProperty("AUTOUIC_OPTIONS");
    cmSystemTools::ReplaceString(opts, ";", "@list_sep@");
    uiFileOptions += opts;
    sep = ";";
    }

  makefile->AddDefinition("_qt_uic_options_files",
              cmOutputConverter::EscapeForCMake(uiFileFiles).c_str());
  makefile->AddDefinition("_qt_uic_options_options",
            cmOutputConverter::EscapeForCMake(uiFileOptions).c_str());

  std::string targetName = target->GetName();
  if (strcmp(qtVersion, "5") == 0)
    {
    cmTarget *qt5Uic = makefile->FindTargetToUse("Qt5::uic");
    if (!qt5Uic)
      {
      // Project does not use Qt5Widgets, but has AUTOUIC ON anyway
      }
    else
      {
      makefile->AddDefinition("_qt_uic_executable", qt5Uic->GetLocation(""));
      }
    }
  else if (strcmp(qtVersion, "4") == 0)
    {
    cmTarget *qt4Uic = makefile->FindTargetToUse("Qt4::uic");
    if (!qt4Uic)
      {
      cmSystemTools::Error("Qt4::uic target not found ",
                          targetName.c_str());
      return;
      }
    makefile->AddDefinition("_qt_uic_executable", qt4Uic->GetLocation(""));
    }
  else
    {
    cmSystemTools::Error("The CMAKE_AUTOUIC feature supports only Qt 4 and "
                        "Qt 5 ", targetName.c_str());
    }
}